

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_point_times_order(secp256k1_gej *point)

{
  int iVar1;
  size_t psize;
  uchar pub [65];
  secp256k1_ge res3;
  secp256k1_gej res2;
  secp256k1_gej res1;
  secp256k1_scalar one;
  secp256k1_scalar zero;
  secp256k1_scalar nx;
  secp256k1_scalar x;
  secp256k1_scalar *in_stack_00000678;
  secp256k1_scalar *in_stack_00000680;
  secp256k1_gej *in_stack_00000688;
  secp256k1_gej *in_stack_00000690;
  secp256k1_ge *in_stack_fffffffffffffd88;
  uchar *pub_00;
  secp256k1_ge *a;
  secp256k1_ge *in_stack_fffffffffffffd98;
  secp256k1_scalar *in_stack_fffffffffffffda0;
  secp256k1_scalar *in_stack_fffffffffffffdb0;
  secp256k1_gej *in_stack_fffffffffffffde8;
  secp256k1_ge *in_stack_fffffffffffffdf0;
  secp256k1_gej *in_stack_fffffffffffffe78;
  secp256k1_ge *in_stack_fffffffffffffe80;
  secp256k1_fe *in_stack_ffffffffffffff98;
  secp256k1_gej *in_stack_ffffffffffffffa0;
  secp256k1_gej *in_stack_ffffffffffffffa8;
  secp256k1_gej *in_stack_ffffffffffffffb0;
  
  memset(&stack0xffffffffffffff98,0,0x20);
  pub_00 = (uchar *)0x41;
  random_scalar_order_test(in_stack_fffffffffffffdb0);
  secp256k1_scalar_negate(in_stack_fffffffffffffda0,(secp256k1_scalar *)in_stack_fffffffffffffd98);
  secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
  secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
  secp256k1_gej_add_var
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x1434d3);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1186,"test condition failed: secp256k1_gej_is_infinity(&res1)");
    abort();
  }
  secp256k1_ge_set_gej(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x143538);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1188,"test condition failed: secp256k1_ge_is_infinity(&res3)");
    abort();
  }
  iVar1 = secp256k1_ge_is_valid_var((secp256k1_ge *)in_stack_fffffffffffffde8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1189,"test condition failed: secp256k1_ge_is_valid_var(&res3) == 0");
    abort();
  }
  iVar1 = secp256k1_eckey_pubkey_serialize
                    (in_stack_fffffffffffffd98,pub_00,(size_t *)in_stack_fffffffffffffd88,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x118a,
            "test condition failed: secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 0) == 0");
    abort();
  }
  a = (secp256k1_ge *)0x41;
  iVar1 = secp256k1_eckey_pubkey_serialize
                    (in_stack_fffffffffffffd98,(uchar *)0x41,(size_t *)in_stack_fffffffffffffd88,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x118c,
            "test condition failed: secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 1) == 0");
    abort();
  }
  secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
  secp256k1_ge_set_gej(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x1436de);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0x1190,"test condition failed: secp256k1_ge_is_infinity(&res3)");
    abort();
  }
  secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
  secp256k1_ge_set_gej(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ge_equals_gej(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
  secp256k1_ge_set_gej(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ge_equals_ge(a,in_stack_fffffffffffffd88);
  return;
}

Assistant:

static void test_point_times_order(const secp256k1_gej *point) {
    /* X * (point + G) + (order-X) * (pointer + G) = 0 */
    secp256k1_scalar x;
    secp256k1_scalar nx;
    secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);
    secp256k1_scalar one = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    secp256k1_gej res1, res2;
    secp256k1_ge res3;
    unsigned char pub[65];
    size_t psize = 65;
    random_scalar_order_test(&x);
    secp256k1_scalar_negate(&nx, &x);
    secp256k1_ecmult(&res1, point, &x, &x); /* calc res1 = x * point + x * G; */
    secp256k1_ecmult(&res2, point, &nx, &nx); /* calc res2 = (order - x) * point + (order - x) * G; */
    secp256k1_gej_add_var(&res1, &res1, &res2, NULL);
    CHECK(secp256k1_gej_is_infinity(&res1));
    secp256k1_ge_set_gej(&res3, &res1);
    CHECK(secp256k1_ge_is_infinity(&res3));
    CHECK(secp256k1_ge_is_valid_var(&res3) == 0);
    CHECK(secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 0) == 0);
    psize = 65;
    CHECK(secp256k1_eckey_pubkey_serialize(&res3, pub, &psize, 1) == 0);
    /* check zero/one edge cases */
    secp256k1_ecmult(&res1, point, &zero, &zero);
    secp256k1_ge_set_gej(&res3, &res1);
    CHECK(secp256k1_ge_is_infinity(&res3));
    secp256k1_ecmult(&res1, point, &one, &zero);
    secp256k1_ge_set_gej(&res3, &res1);
    ge_equals_gej(&res3, point);
    secp256k1_ecmult(&res1, point, &zero, &one);
    secp256k1_ge_set_gej(&res3, &res1);
    ge_equals_ge(&res3, &secp256k1_ge_const_g);
}